

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O2

node_type * __thiscall
st_tree::detail::
node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator[](node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,key_type *key)

{
  int local_54;
  iterator local_50;
  pair<st_tree::detail::valmap_iterator_adaptor_forward<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>,_st_tree::detail::dref_second_vmap<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>_>,_bool>
  local_38;
  
  find(&local_50,this,key);
  if (&(this->
       super_node_base<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_st_tree::detail::ptr_less<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>_>_>
       )._children._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)local_50._base._M_node)
  {
    local_54 = 0;
    node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>
    ::emplace_insert<int_const&>(&local_38,this,key,&local_54);
    local_50._base._M_node = local_38.first._base._M_node;
  }
  return (node_type *)local_50._base._M_node[1]._M_parent;
}

Assistant:

node_type& operator[](const key_type& key) {
        iterator f(this->find(key));
        if (this->end() == f) f = this->insert(key, data_type()).first;
        return *f;
    }